

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O2

uint64_t hashstring(substring s,uint64_t h)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  
  pbVar12 = (byte *)s.end;
  pbVar9 = (byte *)s.begin;
  uVar10 = (long)pbVar12 - (long)pbVar9;
  for (; (pbVar9 < pbVar12 && (*pbVar9 < 0x21)); pbVar9 = pbVar9 + 1) {
    uVar10 = uVar10 - 1;
  }
  do {
    uVar11 = uVar10;
    pbVar6 = pbVar12;
    if (pbVar6 <= pbVar9) break;
    pbVar12 = pbVar6 + -1;
    uVar10 = uVar11 - 1;
  } while (pbVar6[-1] < 0x21);
  lVar7 = 0;
  pbVar12 = pbVar9;
  while( true ) {
    if (pbVar6 == pbVar12) {
      return lVar7 + h;
    }
    bVar1 = *pbVar12;
    if (9 < (byte)(bVar1 - 0x30)) break;
    pbVar12 = pbVar12 + 1;
    lVar7 = lVar7 * 10 + (ulong)bVar1 + -0x30;
  }
  uVar5 = (uint)uVar11;
  iVar2 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / 4);
  pbVar9 = pbVar9 + iVar2 * 4;
  for (lVar7 = (long)-iVar2; uVar8 = (uint)h, lVar7 != 0; lVar7 = lVar7 + 1) {
    uVar8 = ((uint)(*(int *)(pbVar9 + lVar7 * 4) * -0x3361d2af) >> 0x11 |
            *(int *)(pbVar9 + lVar7 * 4) * 0x16a88000) * 0x1b873593 ^ uVar8;
    h = (uint64_t)((uVar8 << 0xd | uVar8 >> 0x13) * 5 + 0xe6546b64);
  }
  uVar4 = 0;
  uVar3 = 0;
  switch(uVar5 & 3) {
  case 3:
    uVar3 = (uint)pbVar9[2] << 0x10;
  case 2:
    uVar4 = uVar3 | (uint)pbVar9[1] << 8;
  case 1:
    uVar8 = uVar8 ^ ((*pbVar9 ^ uVar4) * -0x3361d2af >> 0x11 | (*pbVar9 ^ uVar4) * 0x16a88000) *
                    0x1b873593;
  case 0:
    uVar5 = ((uVar8 ^ uVar5) >> 0x10 ^ uVar8 ^ uVar5) * -0x7a143595;
    uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
    return (ulong)(uVar5 >> 0x10 ^ uVar5);
  }
}

Assistant:

uint64_t hashstring(substring s, uint64_t h)
{
  // trim leading whitespace but not UTF-8
  for (; s.begin < s.end && *(s.begin) <= 0x20 && (int)*(s.begin) >= 0; s.begin++)
    ;
  // trim trailing white space but not UTF-8
  for (; s.end > s.begin && *(s.end - 1) <= 0x20 && (int)*(s.end - 1) >= 0; s.end--)
    ;

  size_t ret = 0;
  char* p = s.begin;
  while (p != s.end)
    if (*p >= '0' && *p <= '9')
      ret = 10 * ret + *(p++) - '0';
    else
      return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h);

  return ret + h;
}